

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memenv.cc
# Opt level: O0

void __thiscall leveldb::anon_unknown_2::FileState::Unref(FileState *this)

{
  int iVar1;
  long lVar2;
  FileState *in_RDI;
  long in_FS_OFFSET;
  bool do_delete;
  MutexLock lock;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  MutexLock::MutexLock((MutexLock *)in_RDI,(Mutex *)0x18d73af);
  in_RDI->refs_ = in_RDI->refs_ + -1;
  if (in_RDI->refs_ < 0) {
    __assert_fail("refs_ >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/helpers/memenv/memenv.cc"
                  ,0x2f,"void leveldb::(anonymous namespace)::FileState::Unref()");
  }
  iVar1 = in_RDI->refs_;
  MutexLock::~MutexLock((MutexLock *)in_RDI);
  if ((iVar1 < 1) && (in_RDI != (FileState *)0x0)) {
    ~FileState(in_RDI);
    operator_delete(in_RDI,0x78);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unref() {
    bool do_delete = false;

    {
      MutexLock lock(&refs_mutex_);
      --refs_;
      assert(refs_ >= 0);
      if (refs_ <= 0) {
        do_delete = true;
      }
    }

    if (do_delete) {
      delete this;
    }
  }